

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> __thiscall
slang::ast::CheckerInstanceSymbol::getPortConnections(CheckerInstanceSymbol *this)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  AssertionInstanceDetails *pAVar3;
  AssertionPortSymbol *formal;
  value_type_pointer ppVar4;
  PropertyExprSyntax *initialExpr;
  Symbol *pSVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  ExpressionSyntax *syntax;
  Type *argType;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  pointer pCVar14;
  tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *this_00;
  Connection *conn;
  pointer this_01;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  undefined1 auVar19 [16];
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> sVar20;
  ActualArg actualArgValue;
  Expression *local_70;
  _Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  local_68;
  ulong uStack_60;
  ulong local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  
  if (this->connectionsResolved != true) {
    this->connectionsResolved = true;
    this_01 = (this->connections)._M_ptr;
    pCVar14 = this_01 + (this->connections)._M_extent._M_extent_value;
LAB_002fd215:
    if (this_01 != pCVar14) {
      Connection::getOutputInitialExpr(this_01);
      pAVar3 = this->body->assertionDetails;
      formal = (AssertionPortSymbol *)this_01->formal;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = formal;
      uVar10 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
               SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
      uVar11 = uVar10 >> ((byte)(pAVar3->argumentMap).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                                .arrays.groups_size_index & 0x3f);
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[uVar10 & 0xff];
      lVar9 = 0;
      do {
        pgVar1 = (pAVar3->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.groups_ + uVar11;
        uVar15 = (uchar)uVar2;
        auVar19[0] = -(pgVar1->m[0].n == uVar15);
        uVar16 = (uchar)((uint)uVar2 >> 8);
        auVar19[1] = -(pgVar1->m[1].n == uVar16);
        uVar17 = (uchar)((uint)uVar2 >> 0x10);
        auVar19[2] = -(pgVar1->m[2].n == uVar17);
        uVar18 = (uchar)((uint)uVar2 >> 0x18);
        auVar19[3] = -(pgVar1->m[3].n == uVar18);
        auVar19[4] = -(pgVar1->m[4].n == uVar15);
        auVar19[5] = -(pgVar1->m[5].n == uVar16);
        auVar19[6] = -(pgVar1->m[6].n == uVar17);
        auVar19[7] = -(pgVar1->m[7].n == uVar18);
        auVar19[8] = -(pgVar1->m[8].n == uVar15);
        auVar19[9] = -(pgVar1->m[9].n == uVar16);
        auVar19[10] = -(pgVar1->m[10].n == uVar17);
        auVar19[0xb] = -(pgVar1->m[0xb].n == uVar18);
        auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
        auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
        auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
        auVar19[0xf] = -(pgVar1->m[0xf].n == uVar18);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          ppVar4 = (pAVar3->argumentMap).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                   .arrays.elements_;
          do {
            uVar6 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            uVar10 = (ulong)uVar6;
            if (formal == (AssertionPortSymbol *)ppVar4[uVar11 * 0xf + uVar10].first) {
              initialExpr = ppVar4[uVar11 * 0xf + uVar10].second.
                            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                            .super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>
                            ._M_head_impl;
              if (initialExpr != (PropertyExprSyntax *)0x0) {
                this_00 = &ppVar4[uVar11 * 0xf + uVar10].second;
                if ((formal->super_Symbol).kind == AssertionPort) {
                  local_68 = (_Variadic_union<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                              )0x0;
                  uStack_60 = uStack_60 & 0xffffffffffffff00;
                  bVar8 = AssertionInstanceExpression::checkAssertionArg
                                    (initialExpr,formal,(ASTContext *)this_00,
                                     (ActualArg *)&local_68._M_first,false);
                  if (bVar8) {
                    *(__index_type *)
                     ((long)&(this_01->actual).
                             super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                             .
                             super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                     + 8) = (__index_type)uStack_60;
                    (this_01->actual).
                    super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    .
                    super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                    ._M_u = local_68;
                  }
                }
                else {
                  syntax = ASTContext::requireSimpleExpr((ASTContext *)this_00,initialExpr);
                  if (syntax != (ExpressionSyntax *)0x0) {
                    local_38 = ppVar4[uVar11 * 0xf + uVar10].second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               assertionInstance;
                    local_68._M_first._M_storage =
                         (_Uninitialized<const_slang::ast::Expression_*,_true>)
                         (this_00->
                         super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                         ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                         super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr
                    ;
                    uStack_60 = *(ulong *)&ppVar4[uVar11 * 0xf + uVar10].second.
                                           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                           .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                                           super__Head_base<1UL,_slang::ast::ASTContext,_false>.
                                           _M_head_impl.lookupIndex;
                    local_58 = ppVar4[uVar11 * 0xf + uVar10].second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               flags.m_bits;
                    pSStack_50 = ppVar4[uVar11 * 0xf + uVar10].second.
                                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                                 instanceOrProc;
                    local_48 = ppVar4[uVar11 * 0xf + uVar10].second.
                               super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                               .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                               super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                               firstTempVar;
                    pRStack_40 = ppVar4[uVar11 * 0xf + uVar10].second.
                                 super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
                                 .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
                                 super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.
                                 randomizeDetails;
                    if (this->body->isProcedural == false) {
                      local_58 = local_58 | 0x20;
                    }
                    if (((this->body->flags).m_bits & 2) != 0) {
                      local_58 = local_58 | 0x100000000000;
                    }
                    pSVar5 = this_01->formal;
                    argType = DeclaredType::getType((DeclaredType *)(pSVar5 + 1));
                    local_70 = Expression::bindArgument
                                         (argType,*(ArgumentDirection *)&pSVar5[5].location,
                                          (bitmask<slang::ast::VariableFlags>)0x0,syntax,
                                          (ASTContext *)&local_68._M_first);
                    std::
                    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                                 *)&this_01->actual,&local_70);
                  }
                }
              }
              this_01 = this_01 + 1;
              goto LAB_002fd215;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
        }
        lVar12 = uVar11 + lVar9;
        lVar9 = lVar9 + 1;
        uVar11 = lVar12 + 1U &
                 (pAVar3->argumentMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>_>
                 .arrays.groups_size_mask;
      } while( true );
    }
  }
  sVar20._M_ptr = (this->connections)._M_ptr;
  sVar20._M_extent._M_extent_value = (this->connections)._M_extent._M_extent_value;
  return sVar20;
}

Assistant:

std::span<const CheckerInstanceSymbol::Connection> CheckerInstanceSymbol::getPortConnections()
    const {
    if (connectionsResolved)
        return connections;

    connectionsResolved = true;

    // We prepopulated some of the connection members but still need
    // to resolve the actual argument value and save it.
    for (auto& conn : connections) {
        conn.getOutputInitialExpr();

        auto argIt = body.assertionDetails.argumentMap.find(&conn.formal);
        SLANG_ASSERT(argIt != body.assertionDetails.argumentMap.end());

        auto& [expr, argCtx] = argIt->second;
        if (!expr)
            continue;

        if (conn.formal.kind == SymbolKind::AssertionPort) {
            AssertionInstanceExpression::ActualArg actualArgValue;
            if (AssertionInstanceExpression::checkAssertionArg(
                    *expr, conn.formal.as<AssertionPortSymbol>(), argCtx, actualArgValue,
                    /* isRecursiveProp */ false)) {
                conn.actual = actualArgValue;
            }
        }
        else if (auto exprSyntax = argCtx.requireSimpleExpr(*expr)) {
            ASTContext context = argCtx;
            if (!body.isProcedural)
                context.flags |= ASTFlags::NonProcedural;

            if (body.flags.has(InstanceFlags::FromBind))
                context.flags |= ASTFlags::BindInstantiation;

            auto& formal = conn.formal.as<FormalArgumentSymbol>();
            conn.actual = &Expression::bindArgument(formal.getType(), formal.direction, {},
                                                    *exprSyntax, context);
        }
    }

    return connections;
}